

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  NodeBase *node_00;
  iterator __x;
  UntypedMapBase **v1;
  KeyMapBase<google::protobuf::MapKey> **v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  Node *node;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  UntypedMapBase *local_20;
  map_index_t local_18;
  undefined4 uStack_14;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_10;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  __x.super_UntypedMapIterator = pos.super_UntypedMapIterator;
  absl_log_internal_check_op_result = (string *)pos.super_UntypedMapIterator.node_;
  local_20 = pos.super_UntypedMapIterator.m_;
  local_18 = pos.super_UntypedMapIterator.bucket_index_;
  uStack_14 = pos.super_UntypedMapIterator._20_4_;
  local_10 = this;
  std::next<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::iterator>
            (__return_storage_ptr__,__x,1);
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::UntypedMapBase_const*>
                 (&pos.super_UntypedMapIterator.m_);
  local_38 = this;
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::KeyMapBase<google::protobuf::MapKey>*>
                 ((KeyMapBase<google::protobuf::MapKey> **)&local_38);
  local_30 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::UntypedMapBase_const*,google::protobuf::internal::KeyMapBase<google::protobuf::MapKey>*>
                       (v1,v2,"pos.m_ == static_cast<Base*>(this)");
  node_00 = pos.super_UntypedMapIterator.node_;
  if (local_30 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
               ,0x645,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  internal::KeyMapBase<google::protobuf::MapKey>::erase_no_destroy
            (&this->super_KeyMapBase<google::protobuf::MapKey>,
             pos.super_UntypedMapIterator.bucket_index_,
             (KeyNode *)pos.super_UntypedMapIterator.node_);
  DestroyNode(this,(Node *)node_00);
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto next = std::next(pos);
    ABSL_DCHECK_EQ(pos.m_, static_cast<Base*>(this));
    auto* node = static_cast<Node*>(pos.node_);
    this->erase_no_destroy(pos.bucket_index_, node);
    DestroyNode(node);
    return next;
  }